

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlValidateNCName(xmlChar *value,int space)

{
  int iVar1;
  bool bVar2;
  uint local_40;
  int local_30;
  uint local_2c;
  int l;
  int c;
  xmlChar *cur;
  xmlChar *pxStack_18;
  int space_local;
  xmlChar *value_local;
  
  if (value == (xmlChar *)0x0) {
    return -1;
  }
  _l = value;
  if (space != 0) {
    while( true ) {
      bVar2 = true;
      if ((*_l != 0x20) && ((*_l < 9 || (bVar2 = true, 10 < *_l)))) {
        bVar2 = *_l == 0xd;
      }
      if (!bVar2) break;
      _l = _l + 1;
    }
  }
  if ((((0x60 < *_l) && (*_l < 0x7b)) || ((0x40 < *_l && (*_l < 0x5b)))) || (*_l == 0x5f)) {
    do {
      _l = _l + 1;
      if (((*_l < 0x61) || (bVar2 = true, 0x7a < *_l)) &&
         (((*_l < 0x41 || (bVar2 = true, 0x5a < *_l)) &&
          ((((*_l < 0x30 || (bVar2 = true, 0x39 < *_l)) && (bVar2 = true, *_l != 0x5f)) &&
           (bVar2 = true, *_l != 0x2d)))))) {
        bVar2 = *_l == 0x2e;
      }
    } while (bVar2);
    if (space != 0) {
      while( true ) {
        bVar2 = true;
        if ((*_l != 0x20) && ((*_l < 9 || (bVar2 = true, 10 < *_l)))) {
          bVar2 = *_l == 0xd;
        }
        if (!bVar2) break;
        _l = _l + 1;
      }
    }
    if (*_l == 0) {
      return 0;
    }
  }
  _l = value;
  cur._4_4_ = space;
  pxStack_18 = value;
  local_2c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,&local_30);
  if (cur._4_4_ != 0) {
    while( true ) {
      if ((int)local_2c < 0x100) {
        bVar2 = true;
        if ((local_2c != 0x20) && (((int)local_2c < 9 || (bVar2 = true, 10 < (int)local_2c)))) {
          bVar2 = local_2c == 0xd;
        }
      }
      else {
        bVar2 = false;
      }
      if (!bVar2) break;
      _l = _l + local_30;
      local_2c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,_l,&local_30);
    }
  }
  if ((int)local_2c < 0x100) {
    if (((((0x40 < (int)local_2c) && ((int)local_2c < 0x5b)) ||
         ((0x60 < (int)local_2c && ((int)local_2c < 0x7b)))) ||
        ((0xbf < (int)local_2c && ((int)local_2c < 0xd7)))) ||
       (((0xd7 < (int)local_2c && ((int)local_2c < 0xf7)) || (0xf7 < (int)local_2c))))
    goto LAB_0015eeb7;
  }
  else {
    iVar1 = xmlCharInRange(local_2c,&xmlIsBaseCharGroup);
    if (iVar1 != 0) goto LAB_0015eeb7;
  }
  if ((((int)local_2c < 0x100) ||
      (((((int)local_2c < 0x4e00 || (0x9fa5 < (int)local_2c)) && (local_2c != 0x3007)) &&
       (((int)local_2c < 0x3021 || (0x3029 < (int)local_2c)))))) && (local_2c != 0x5f)) {
    return 1;
  }
LAB_0015eeb7:
  _l = _l + local_30;
  local_2c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,_l,&local_30);
  do {
    if ((int)local_2c < 0x100) {
      if (((((int)local_2c < 0x41) || (bVar2 = true, 0x5a < (int)local_2c)) &&
          (((int)local_2c < 0x61 || (bVar2 = true, 0x7a < (int)local_2c)))) &&
         (((((int)local_2c < 0xc0 || (bVar2 = true, 0xd6 < (int)local_2c)) &&
           (((int)local_2c < 0xd8 || (bVar2 = true, 0xf6 < (int)local_2c)))) &&
          (bVar2 = true, (int)local_2c < 0xf8)))) {
LAB_0015ef83:
        if (((int)local_2c < 0x100) ||
           (((((int)local_2c < 0x4e00 || (bVar2 = true, 0x9fa5 < (int)local_2c)) &&
             (bVar2 = true, local_2c != 0x3007)) &&
            (((int)local_2c < 0x3021 || (bVar2 = true, 0x3029 < (int)local_2c)))))) {
          if ((int)local_2c < 0x100) {
            if (((int)local_2c < 0x30) || (bVar2 = true, 0x39 < (int)local_2c)) {
LAB_0015f02b:
              bVar2 = true;
              if ((local_2c != 0x2e) &&
                 ((bVar2 = true, local_2c != 0x2d && (bVar2 = true, local_2c != 0x5f)))) {
                if (0xff < (int)local_2c) {
                  iVar1 = xmlCharInRange(local_2c,&xmlIsCombiningGroup);
                  bVar2 = true;
                  if (iVar1 != 0) goto LAB_0015f0bd;
                }
                if ((int)local_2c < 0x100) {
                  local_40 = (uint)(local_2c == 0xb7);
                }
                else {
                  local_40 = xmlCharInRange(local_2c,&xmlIsExtenderGroup);
                }
                bVar2 = local_40 != 0;
              }
            }
          }
          else {
            iVar1 = xmlCharInRange(local_2c,&xmlIsDigitGroup);
            bVar2 = true;
            if (iVar1 == 0) goto LAB_0015f02b;
          }
        }
      }
    }
    else {
      iVar1 = xmlCharInRange(local_2c,&xmlIsBaseCharGroup);
      bVar2 = true;
      if (iVar1 == 0) goto LAB_0015ef83;
    }
LAB_0015f0bd:
    if (!bVar2) {
      if (cur._4_4_ != 0) {
        while( true ) {
          if ((int)local_2c < 0x100) {
            bVar2 = true;
            if ((local_2c != 0x20) && (((int)local_2c < 9 || (bVar2 = true, 10 < (int)local_2c)))) {
              bVar2 = local_2c == 0xd;
            }
          }
          else {
            bVar2 = false;
          }
          if (!bVar2) break;
          _l = _l + local_30;
          local_2c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,_l,&local_30);
        }
      }
      value_local._4_4_ = (uint)(local_2c != 0);
      return value_local._4_4_;
    }
    _l = _l + local_30;
    local_2c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,_l,&local_30);
  } while( true );
}

Assistant:

int
xmlValidateNCName(const xmlChar *value, int space) {
    const xmlChar *cur = value;
    int c,l;

    if (value == NULL)
        return(-1);

    /*
     * First quick algorithm for ASCII range
     */
    if (space)
	while (IS_BLANK_CH(*cur)) cur++;
    if (((*cur >= 'a') && (*cur <= 'z')) || ((*cur >= 'A') && (*cur <= 'Z')) ||
	(*cur == '_'))
	cur++;
    else
	goto try_complex;
    while (((*cur >= 'a') && (*cur <= 'z')) ||
	   ((*cur >= 'A') && (*cur <= 'Z')) ||
	   ((*cur >= '0') && (*cur <= '9')) ||
	   (*cur == '_') || (*cur == '-') || (*cur == '.'))
	cur++;
    if (space)
	while (IS_BLANK_CH(*cur)) cur++;
    if (*cur == 0)
	return(0);

try_complex:
    /*
     * Second check for chars outside the ASCII range
     */
    cur = value;
    c = CUR_SCHAR(cur, l);
    if (space) {
	while (IS_BLANK(c)) {
	    cur += l;
	    c = CUR_SCHAR(cur, l);
	}
    }
    if ((!IS_LETTER(c)) && (c != '_'))
	return(1);
    cur += l;
    c = CUR_SCHAR(cur, l);
    while (IS_LETTER(c) || IS_DIGIT(c) || (c == '.') ||
	   (c == '-') || (c == '_') || IS_COMBINING(c) ||
	   IS_EXTENDER(c)) {
	cur += l;
	c = CUR_SCHAR(cur, l);
    }
    if (space) {
	while (IS_BLANK(c)) {
	    cur += l;
	    c = CUR_SCHAR(cur, l);
	}
    }
    if (c != 0)
	return(1);

    return(0);
}